

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O3

int Lodtalk_lex_init_extra(ParserScannerExtraData *yy_user_defined,yyscan_t *ptr_yy_globals)

{
  undefined8 *puVar1;
  int *piVar2;
  
  if (ptr_yy_globals == (yyscan_t *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
  }
  else {
    puVar1 = (undefined8 *)calloc(1,0xa0);
    *ptr_yy_globals = puVar1;
    if (puVar1 != (undefined8 *)0x0) {
      *puVar1 = yy_user_defined;
      return 0;
    }
    piVar2 = __errno_location();
    *piVar2 = 0xc;
  }
  return 1;
}

Assistant:

int yylex_init_extra( YY_EXTRA_TYPE yy_user_defined, yyscan_t* ptr_yy_globals )
{
    struct yyguts_t dummy_yyguts;

    yyset_extra (yy_user_defined, &dummy_yyguts);

    if (ptr_yy_globals == NULL){
        errno = EINVAL;
        return 1;
    }

    *ptr_yy_globals = (yyscan_t) yyalloc ( sizeof( struct yyguts_t ), &dummy_yyguts );

    if (*ptr_yy_globals == NULL){
        errno = ENOMEM;
        return 1;
    }

    /* By setting to 0xAA, we expose bugs in
    yy_init_globals. Leave at 0x00 for releases. */
    memset(*ptr_yy_globals,0x00,sizeof(struct yyguts_t));

    yyset_extra (yy_user_defined, *ptr_yy_globals);

    return yy_init_globals ( *ptr_yy_globals );
}